

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * doctest::toString(String *__return_storage_ptr__,float in)

{
  long *__src;
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  string d;
  ostringstream oss;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  anon_union_24_2_13149d16_for_String_2 local_1c8;
  long *local_1b0 [2];
  long local_1a0 [2];
  anon_union_24_2_13149d16_for_String_2 local_190;
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190.data);
  *(undefined8 *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18) + -0x10) = 5;
  *(uint *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190.data.ptr + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>((double)in);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1e8,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1e0 + -1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_1e8);
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1b0);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0],local_1a0[0] + 1);
    }
  }
  __src = local_1e8;
  sVar2 = strlen((char *)local_1e8);
  pcVar3 = String::allocate((String *)&local_1c8.data,(uint)sVar2);
  memcpy(pcVar3,__src,sVar2 & 0xffffffff);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.data);
  std::ios_base::~ios_base(local_120);
  pcVar3 = String::allocate((String *)&local_190.data,1);
  *pcVar3 = 'f';
  operator+(__return_storage_ptr__,(String *)&local_1c8.data,(String *)&local_190.data);
  if ((local_190.buf[0x17] < '\0') && (local_190.data.ptr != (char *)0x0)) {
    operator_delete__(local_190.data.ptr);
  }
  if ((local_1c8.buf[0x17] < '\0') && (local_1c8.data.ptr != (char *)0x0)) {
    operator_delete__(local_1c8.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }